

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O0

int __thiscall Fl_Class_Type::has_function(Fl_Class_Type *this,char *rtype,char *sig)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Fl_Function_Type *fn;
  Fl_Type *child;
  char *sig_local;
  char *rtype_local;
  Fl_Class_Type *this_local;
  
  fn = (Fl_Function_Type *)(this->super_Fl_Type).next;
  while( true ) {
    bVar1 = false;
    if (fn != (Fl_Function_Type *)0x0) {
      bVar1 = (this->super_Fl_Type).level < (fn->super_Fl_Type).level;
    }
    if (!bVar1) break;
    if ((fn->super_Fl_Type).level == (this->super_Fl_Type).level + 1) {
      iVar2 = (*(fn->super_Fl_Type)._vptr_Fl_Type[5])();
      iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"Function");
      if ((iVar2 == 0) && (iVar2 = Fl_Function_Type::has_signature(fn,rtype,sig), iVar2 != 0)) {
        return 1;
      }
    }
    fn = (Fl_Function_Type *)(fn->super_Fl_Type).next;
  }
  return 0;
}

Assistant:

int Fl_Class_Type::has_function(const char *rtype, const char *sig) const {
  Fl_Type *child;
  for (child = next; child && child->level > level; child = child->next) {
    if (child->level == level+1 && strcmp(child->type_name(), "Function")==0) {
      const Fl_Function_Type *fn = (const Fl_Function_Type*)child;
      if (fn->has_signature(rtype, sig))
        return 1;
    }
  }
  return 0;
}